

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O0

void __thiscall icu_63::Formattable::Formattable(Formattable *this,int64_t value)

{
  EVP_PKEY_CTX *ctx;
  int64_t value_local;
  Formattable *this_local;
  
  ctx = (EVP_PKEY_CTX *)value;
  UObject::UObject(&this->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__Formattable_0049bb28;
  UnicodeString::UnicodeString(&this->fBogus);
  init(this,ctx);
  this->fType = kInt64;
  (this->fValue).fInt64 = value;
  return;
}

Assistant:

Formattable::Formattable(int64_t value)
{
    init();
    fType = kInt64;
    fValue.fInt64 = value;
}